

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Copy(Compiler *this,Frag arg)

{
  ostream *poVar1;
  Frag FVar2;
  LogMessage local_1a0;
  Compiler *local_20;
  Compiler *this_local;
  Frag arg_local;
  
  local_20 = this;
  this_local = (Compiler *)arg;
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc",0x326
            );
  poVar1 = LogMessage::stream(&local_1a0);
  std::operator<<(poVar1,"Compiler::Copy called!");
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  this->failed_ = true;
  FVar2 = NoMatch(this);
  return FVar2;
}

Assistant:

Frag Compiler::Copy(Frag arg) {
  // We're using WalkExponential; there should be no copying.
  LOG(DFATAL) << "Compiler::Copy called!";
  failed_ = true;
  return NoMatch();
}